

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

void render_image(element_t *element,render_context_t *context,render_state_t *state)

{
  _Bool _Var1;
  float x_00;
  float y_00;
  undefined1 local_98 [8];
  render_state_t new_state;
  float _h;
  float _w;
  float _y;
  float _x;
  length_t y;
  length_t x;
  length_t h;
  length_t w;
  render_state_t *state_local;
  render_context_t *context_local;
  element_t *element_local;
  
  _Var1 = is_display_none(element);
  if ((!_Var1) && (_Var1 = is_visibility_hidden(element), !_Var1)) {
    h.value = 0.0;
    h.type = length_type_fixed;
    x.value = 0.0;
    x.type = length_type_fixed;
    parse_length(element,0x29,&h,false,false);
    parse_length(element,0x10,&x,false,false);
    if ((h.value != 0.0) || (NAN(h.value))) {
      if ((x.value != 0.0) || (NAN(x.value))) {
        y.value = 0.0;
        y.type = length_type_fixed;
        _y = 0.0;
        _x = 1.4013e-45;
        parse_length(element,0x2a,&y,true,false);
        parse_length(element,0x2d,(length_t *)&_y,true,false);
        x_00 = resolve_length(state,&y,'x');
        y_00 = resolve_length(state,(length_t *)&_y,'y');
        new_state.extents.h = resolve_length(state,&h,'x');
        new_state.extents.w = resolve_length(state,&x,'y');
        render_state_begin(element,(render_state_t *)local_98,state);
        new_state.extents.x = new_state.extents.h;
        new_state.extents.y = new_state.extents.w;
        new_state.matrix.e = x_00;
        new_state.matrix.f = y_00;
        draw_image(element,context,(render_state_t *)local_98,x_00,y_00,new_state.extents.h,
                   new_state.extents.w);
        render_state_end((render_state_t *)local_98);
      }
    }
  }
  return;
}

Assistant:

static void render_image(const element_t* element, const render_context_t* context, render_state_t* state)
{
    if(is_display_none(element) || is_visibility_hidden(element))
        return;
    length_t w = {0, length_type_fixed};
    length_t h = {0, length_type_fixed};

    parse_length(element, ATTR_WIDTH, &w, false, false);
    parse_length(element, ATTR_HEIGHT, &h, false, false);
    if(is_length_zero(w) || is_length_zero(h))
        return;
    length_t x = {0, length_type_fixed};
    length_t y = {0, length_type_fixed};

    parse_length(element, ATTR_X, &x, true, false);
    parse_length(element, ATTR_Y, &y, true, false);

    float _x = resolve_length(state, &x, 'x');
    float _y = resolve_length(state, &y, 'y');
    float _w = resolve_length(state, &w, 'x');
    float _h = resolve_length(state, &h, 'y');

    render_state_t new_state;
    render_state_begin(element, &new_state, state);

    new_state.extents.x = _x;
    new_state.extents.y = _y;
    new_state.extents.w = _w;
    new_state.extents.h = _h;
    draw_image(element, context, &new_state, _x, _y, _w, _h);
    render_state_end(&new_state);
}